

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

string * __thiscall
wabt::interp::Thread::TraceSource::Pick_abi_cxx11_
          (string *__return_storage_ptr__,TraceSource *this,Index index,Instr instr)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  u64 uVar4;
  u64 uVar5;
  Enum EVar6;
  Value *pVVar7;
  pointer pGVar9;
  char *pcVar10;
  long lVar11;
  double dVar12;
  Info local_78;
  ValueType VVar8;
  
  pVVar7 = Thread::Pick(this->thread_,index);
  fVar1 = (float)(pVVar7->field_0).f32_;
  uVar2 = *(uint *)((long)&pVVar7->field_0 + 4);
  uVar5 = (pVVar7->field_0).i64_;
  dVar12 = (double)(pVVar7->field_0).i64_;
  uVar4 = (pVVar7->field_0).i64_;
  uVar3 = *(ulong *)((long)&pVVar7->field_0 + 8);
  lVar11 = 3;
  do {
    Opcode::GetInfo(&local_78,&instr.op);
    if (local_78.param_types[lVar11 + -1].enum_ != Void) goto LAB_001c37cf;
    lVar11 = lVar11 + -1;
  } while (lVar11 != 0);
  lVar11 = 0;
LAB_001c37cf:
  if ((uint)lVar11 < index) {
LAB_001c37ed:
    if ((instr.op.enum_ - TableSet < 4) && (instr.op.enum_ - TableSet != 2)) {
      pGVar9 = (pointer)(this->thread_->mod_->desc_).tables.
                        super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = (ulong)instr.field_2.imm_u32 * 3;
    }
    else {
      if (instr.op.enum_ - LocalSet < 2) {
        VVar8 = GetLocalType(this,instr.field_2.imm_u32);
        EVar6 = VVar8.enum_;
        goto LAB_001c3854;
      }
      if (instr.op.enum_ != GlobalSet) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"?","");
        return __return_storage_ptr__;
      }
      pGVar9 = (this->thread_->mod_->desc_).globals.
               super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = (ulong)instr.field_2.imm_u32 * 9;
    }
    EVar6 = *(Enum *)((long)(&((TableType *)&pGVar9->type)->super_ExternType + lVar11) + 0xc);
  }
  else {
    Opcode::GetInfo(&local_78,&instr.op);
    EVar6 = local_78.param_types[(int)((uint)lVar11 - index)].enum_;
    if (EVar6 == Void) goto LAB_001c37ed;
  }
LAB_001c3854:
  switch(EVar6) {
  case ExternRef:
    pcVar10 = "externref";
    goto LAB_001c38a4;
  case FuncRef:
    pcVar10 = "funcref";
    goto LAB_001c38a4;
  case 0xfffffff1:
  case 0xfffffff2:
  case 0xfffffff3:
  case FuncRef|I8U:
  case 0xfffffff5:
  case FuncRef|I16U:
  case FuncRef|I32U:
  case ~I32U:
  case I16:
  case I8:
switchD_001c386f_caseD_fffffff1:
    abort();
  case V128:
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"0x%08x 0x%08x 0x%08x 0x%08x",(ulong)(uint)fVar1,(ulong)uVar2,
               uVar3,uVar3 >> 0x20);
    break;
  case F64:
    goto LAB_001c38d7;
  case F32:
    dVar12 = (double)fVar1;
LAB_001c38d7:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%g",dVar12);
    break;
  case I64:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%lu",uVar5);
    break;
  case I32:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%u",(ulong)(uint)fVar1);
    break;
  default:
    if (EVar6 != ExnRef) goto switchD_001c386f_caseD_fffffff1;
    pcVar10 = "exnref";
LAB_001c38a4:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%s:%zd",pcVar10,uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Thread::TraceSource::Pick(Index index, Instr instr) {
  Value val = thread_->Pick(index);
  const char* reftype;
  // Estimate number of operands.
  // TODO: Instead, record this accurately in opcode.def.
  Index num_operands = 3;
  for (Index i = 3; i >= 1; i--) {
    if (instr.op.GetParamType(i) == ValueType::Void) {
      num_operands--;
    } else {
      break;
    }
  }
  auto type = index > num_operands
                  ? Type(ValueType::Void)
                  : instr.op.GetParamType(num_operands - index + 1);
  if (type == ValueType::Void) {
    // Void should never be displayed normally; we only expect to see it when
    // the stack may have different a different type. This is likely to occur
    // with an index; try to see which type we should expect.
    switch (instr.op) {
      case Opcode::GlobalSet: type = GetGlobalType(instr.imm_u32); break;
      case Opcode::LocalSet:
      case Opcode::LocalTee:  type = GetLocalType(instr.imm_u32); break;
      case Opcode::TableSet:
      case Opcode::TableGrow:
      case Opcode::TableFill: type = GetTableElementType(instr.imm_u32); break;
      default: return "?";
    }
  }

  switch (type) {
    case ValueType::I32: return StringPrintf("%u", val.Get<u32>());
    case ValueType::I64: return StringPrintf("%" PRIu64, val.Get<u64>());
    case ValueType::F32: return StringPrintf("%g", val.Get<f32>());
    case ValueType::F64: return StringPrintf("%g", val.Get<f64>());
    case ValueType::V128: {
      auto v = val.Get<v128>();
      return StringPrintf("0x%08x 0x%08x 0x%08x 0x%08x", v.u32(0), v.u32(1),
                          v.u32(2), v.u32(3));
    }

      // clang-format off
    case ValueType::FuncRef:    reftype = "funcref"; break;
    case ValueType::ExternRef:  reftype = "externref"; break;
    case ValueType::ExnRef:     reftype = "exnref"; break;
      // clang-format on

    default:
      WABT_UNREACHABLE;
      break;
  }

  // Handle ref types.
  return StringPrintf("%s:%" PRIzd, reftype, val.Get<Ref>().index);
}